

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O2

rgba_t sfc::reduce_color(rgba_t color,Mode to_mode)

{
  rgba_t rVar1;
  
  rVar1 = (*(code *)(&DAT_00150fc8 + *(int *)(&DAT_00150fc8 + (ulong)to_mode * 4)))();
  return rVar1;
}

Assistant:

inline rgba_t reduce_color(const rgba_t color, Mode to_mode) {
  switch (to_mode) {
  case Mode::snes:
  case Mode::snes_mode7:
  case Mode::gbc:
  case Mode::gba:
  case Mode::gba_affine:
    if (((color & 0xff000000) >> 24) < 0x80) {
      return transparent_color;
    } else {
      rgba_color c(color);
      c.r >>= 3;
      c.g >>= 3;
      c.b >>= 3;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::gb:
    {
      rgba_color c(color);
      channel_t gray = c.r * 0.299 + c.g * 0.587 + c.b * 0.114;
      if (gray <= 0x40) gray = 0;
      else if (gray <= 0x80) gray = 1;
      else if (gray <= 0xc0) gray = 2;
      else gray = 3;
      c.r = c.g = c.b = gray;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::ws:
  case Mode::ngp:
    {
      // TODO: WonderSwan technically supports 8 out of 16 gray shades.
      // Currently, we do not support this additional distinction.
      // Note that Neo Geo Pocket only supports 8 shades.
      rgba_color c(color);
      channel_t gray = c.r * 0.299 + c.g * 0.587 + c.b * 0.114;
      c.r = c.g = c.b = gray >> 5;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::md:
  case Mode::pce:
  case Mode::pce_sprite:
    if (((color & 0xff000000) >> 24) < 0x80) {
      return transparent_color;
    } else {
      rgba_color c(color);
      c.r >>= 5;
      c.g >>= 5;
      c.b >>= 5;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::sms: {
    rgba_color c(color);
    c.r >>= 6;
    c.g >>= 6;
    c.b >>= 6;
    rgba_t scaled = c;
    return (scaled & 0x00ffffff) + 0xff000000;
  }
    break;
  case Mode::wsc:
  case Mode::wsc_packed:
  case Mode::ngpc:
  case Mode::gg:
    if (((color & 0xff000000) >> 24) < 0x80) {
      return transparent_color;
    } else {
      rgba_color c(color);
      c.r >>= 4;
      c.g >>= 4;
      c.b >>= 4;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::none:
    return 0;
  }
}